

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorProto::MergeFrom
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  string *psVar4;
  string *psVar5;
  LogMessage *pLVar6;
  FileOptions *pFVar7;
  SourceCodeInfo *pSVar8;
  LogFinisher local_c9;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x7b1);
    pLVar6 = internal::LogMessage::operator<<(&local_90,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar6);
    internal::LogMessage::~LogMessage(&local_90);
  }
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->dependency_).super_RepeatedPtrFieldBase,
             &(from->dependency_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
            (&(this->message_type_).super_RepeatedPtrFieldBase,
             &(from->message_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             &(from->enum_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
            (&(this->service_).super_RepeatedPtrFieldBase,
             &(from->service_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
            (&(this->extension_).super_RepeatedPtrFieldBase,
             &(from->extension_).super_RepeatedPtrFieldBase);
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar6 = internal::LogMessage::operator<<(&local_58,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar6);
    internal::LogMessage::~LogMessage(&local_58);
  }
  iVar1 = (from->public_dependency_).current_size_;
  if (iVar1 != 0) {
    RepeatedField<int>::Reserve
              (&this->public_dependency_,iVar1 + (this->public_dependency_).current_size_);
    memcpy(((this->public_dependency_).rep_)->elements + (this->public_dependency_).current_size_,
           ((from->public_dependency_).rep_)->elements,
           (long)(from->public_dependency_).current_size_ << 2);
    (this->public_dependency_).current_size_ =
         (this->public_dependency_).current_size_ + (from->public_dependency_).current_size_;
  }
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar6 = internal::LogMessage::operator<<(&local_c8,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=(&local_c9,pLVar6);
    internal::LogMessage::~LogMessage(&local_c8);
  }
  iVar1 = (from->weak_dependency_).current_size_;
  if (iVar1 != 0) {
    RepeatedField<int>::Reserve
              (&this->weak_dependency_,iVar1 + (this->weak_dependency_).current_size_);
    memcpy(((this->weak_dependency_).rep_)->elements + (this->weak_dependency_).current_size_,
           ((from->weak_dependency_).rep_)->elements,
           (long)(from->weak_dependency_).current_size_ << 2);
    (this->weak_dependency_).current_size_ =
         (this->weak_dependency_).current_size_ + (from->weak_dependency_).current_size_;
  }
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 0x1f) != 0) {
    if ((uVar2 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      psVar4 = (from->name_).ptr_;
      psVar5 = (this->name_).ptr_;
      if (psVar5 != psVar4) {
        if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,psVar4);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar5);
        }
      }
    }
    if ((uVar2 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      psVar4 = (from->package_).ptr_;
      psVar5 = (this->package_).ptr_;
      if (psVar5 != psVar4) {
        if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena(&this->package_,psVar4);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar5);
        }
      }
    }
    if ((uVar2 & 4) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      psVar4 = (from->syntax_).ptr_;
      psVar5 = (this->syntax_).ptr_;
      if (psVar5 != psVar4) {
        if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena(&this->syntax_,psVar4);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar5);
        }
      }
    }
    if ((uVar2 & 8) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      if (this->options_ == (FileOptions *)0x0) {
        pFVar7 = (FileOptions *)operator_new(0xb0);
        FileOptions::FileOptions(pFVar7);
        this->options_ = pFVar7;
      }
      pFVar7 = from->options_;
      if (pFVar7 == (FileOptions *)0x0) {
        pFVar7 = (FileOptions *)&_FileOptions_default_instance_;
      }
      FileOptions::MergeFrom(this->options_,pFVar7);
    }
    if ((uVar2 & 0x10) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      if (this->source_code_info_ == (SourceCodeInfo *)0x0) {
        pSVar8 = (SourceCodeInfo *)operator_new(0x30);
        SourceCodeInfo::SourceCodeInfo(pSVar8);
        this->source_code_info_ = pSVar8;
      }
      pSVar8 = from->source_code_info_;
      if (pSVar8 == (SourceCodeInfo *)0x0) {
        pSVar8 = (SourceCodeInfo *)&_SourceCodeInfo_default_instance_;
      }
      SourceCodeInfo::MergeFrom(this->source_code_info_,pSVar8);
    }
  }
  return;
}

Assistant:

void FileDescriptorProto::MergeFrom(const FileDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  dependency_.MergeFrom(from.dependency_);
  message_type_.MergeFrom(from.message_type_);
  enum_type_.MergeFrom(from.enum_type_);
  service_.MergeFrom(from.service_);
  extension_.MergeFrom(from.extension_);
  public_dependency_.MergeFrom(from.public_dependency_);
  weak_dependency_.MergeFrom(from.weak_dependency_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 31u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_name();
      name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      set_has_package();
      package_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.package_);
    }
    if (cached_has_bits & 0x00000004u) {
      set_has_syntax();
      syntax_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.syntax_);
    }
    if (cached_has_bits & 0x00000008u) {
      mutable_options()->::google::protobuf::FileOptions::MergeFrom(from.options());
    }
    if (cached_has_bits & 0x00000010u) {
      mutable_source_code_info()->::google::protobuf::SourceCodeInfo::MergeFrom(from.source_code_info());
    }
  }
}